

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_sort.c
# Opt level: O2

void down_heap(int from,int to)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = arr[from];
  while (from <= to / 2) {
    uVar2 = from * 2;
    uVar3 = uVar2;
    if (((int)uVar2 < to) && (uVar3 = uVar2 | 1, arr[(int)uVar2] <= arr[(int)(uVar2 | 1)])) {
      uVar3 = uVar2;
    }
    if (iVar1 <= arr[(int)uVar3]) break;
    arr[from] = arr[(int)uVar3];
    from = uVar3;
  }
  arr[from] = iVar1;
  return;
}

Assistant:

void down_heap(int from, int to) {
  int val = arr[from];

  int i = from;
  while (i <= to / 2) {
    int j = i * 2;
    if (j + 1 <= to && arr[j] > arr[j + 1]) {
      j++;
    }

    if (val <= arr[j]) {
      break;
    }

    arr[i] = arr[j];
    i = j;
  }

  arr[i] = val;
}